

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetModuleExportList(JSContext *ctx,JSModuleDef *m,JSCFunctionListEntry *tab,int len)

{
  JSValue val_00;
  int iVar1;
  long lVar2;
  ulong uVar3;
  int in_ECX;
  long in_RDX;
  JSContext *in_RDI;
  JSValue JVar4;
  JSCFunctionListEntry *e;
  JSValue val;
  int i;
  JSValue v;
  JSValue in_stack_fffffffffffffee8;
  JSValueUnion in_stack_fffffffffffffef8;
  JSValueUnion in_stack_ffffffffffffff00;
  JSValueUnion in_stack_ffffffffffffff08;
  int local_a0;
  JSValueUnion local_60;
  undefined4 uStack_c;
  
  local_a0 = 0;
  local_60 = in_stack_ffffffffffffff08;
  while( true ) {
    if (in_ECX <= local_a0) {
      return 0;
    }
    lVar2 = in_RDX + (long)local_a0 * 0x20;
    uVar3 = (ulong)*(byte *)(lVar2 + 9);
    switch(uVar3) {
    case 0:
      JS_NewCFunction2((JSContext *)in_stack_ffffffffffffff00.ptr,
                       (JSCFunction *)in_stack_fffffffffffffef8.ptr,
                       (char *)in_stack_fffffffffffffee8.tag,in_stack_fffffffffffffee8.u._4_4_,
                       in_stack_fffffffffffffee8.u._0_4_,0);
      break;
    default:
      abort();
    case 3:
      JS_NewString((JSContext *)in_stack_fffffffffffffee8.tag,
                   (char *)in_stack_fffffffffffffee8.u.ptr);
      break;
    case 4:
      break;
    case 5:
      lVar2 = *(long *)(lVar2 + 0x10);
      if (lVar2 == (int)lVar2) {
        local_60._4_4_ = uStack_c;
        local_60.int32 = (int)lVar2;
      }
      else {
        JVar4 = __JS_NewFloat64(in_RDI,(double)lVar2);
        local_60 = JVar4.u;
      }
      break;
    case 6:
      JVar4 = __JS_NewFloat64(in_RDI,*(double *)(lVar2 + 0x10));
      in_stack_fffffffffffffef8 = JVar4.u;
      in_stack_ffffffffffffff00 = (JSValueUnion)JVar4.tag;
      break;
    case 8:
      in_stack_fffffffffffffee8 = JS_NewObject((JSContext *)0x146421);
      JVar4.tag = (int64_t)in_stack_ffffffffffffff00.ptr;
      JVar4.u.ptr = in_stack_fffffffffffffef8.ptr;
      JS_SetPropertyFunctionList
                ((JSContext *)in_stack_fffffffffffffee8.tag,JVar4,
                 (JSCFunctionListEntry *)in_stack_fffffffffffffee8.u.ptr,(int)(uVar3 >> 0x20));
    }
    val_00.tag = (int64_t)local_60.ptr;
    val_00.u.ptr = in_stack_ffffffffffffff00.ptr;
    iVar1 = JS_SetModuleExport((JSContext *)in_stack_fffffffffffffef8.ptr,
                               (JSModuleDef *)in_stack_fffffffffffffee8.tag,
                               (char *)in_stack_fffffffffffffee8.u.ptr,val_00);
    if (iVar1 != 0) break;
    local_a0 = local_a0 + 1;
  }
  return -1;
}

Assistant:

int JS_SetModuleExportList(JSContext *ctx, JSModuleDef *m,
                           const JSCFunctionListEntry *tab, int len)
{
    int i;
    JSValue val;

    for(i = 0; i < len; i++) {
        const JSCFunctionListEntry *e = &tab[i];
        switch(e->def_type) {
        case JS_DEF_CFUNC:
            val = JS_NewCFunction2(ctx, e->u.func.cfunc.generic,
                                   e->name, e->u.func.length, e->u.func.cproto, e->magic);
            break;
        case JS_DEF_PROP_STRING:
            val = JS_NewString(ctx, e->u.str);
            break;
        case JS_DEF_PROP_INT32:
            val = JS_NewInt32(ctx, e->u.i32);
            break;
        case JS_DEF_PROP_INT64:
            val = JS_NewInt64(ctx, e->u.i64);
            break;
        case JS_DEF_PROP_DOUBLE:
            val = __JS_NewFloat64(ctx, e->u.f64);
            break;
        case JS_DEF_OBJECT:
            val = JS_NewObject(ctx);
            JS_SetPropertyFunctionList(ctx, val, e->u.prop_list.tab, e->u.prop_list.len);
            break;
        default:
            abort();
        }
        if (JS_SetModuleExport(ctx, m, e->name, val))
            return -1;
    }
    return 0;
}